

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::addKernelInfo(CLIntercept *this,cl_kernel kernel,cl_program program,string *kernelName)

{
  mapped_type *pmVar1;
  mapped_type *this_00;
  SConfig *pSVar2;
  string *in_RCX;
  string *in_RDX;
  CLIntercept *in_RSI;
  CLIntercept *in_RDI;
  string demangledName;
  SKernelInfo *kernelInfo;
  SProgramInfo *programInfo;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  string local_68 [32];
  key_type *in_stack_ffffffffffffffb8;
  map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
  *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pmVar1 = std::
           map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
           ::operator[]((map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
                         *)in_stack_ffffffffffffffc0,(key_type *)in_stack_ffffffffffffffb8);
  this_00 = std::
            map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
            ::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pSVar2 = config(in_RDI);
  if ((pSVar2->DemangleKernelNames & 1U) == 0) {
    std::__cxx11::string::string(local_68,in_RCX);
  }
  else {
    demangle(in_stack_ffffffffffffffd8);
  }
  std::__cxx11::string::operator=((string *)this_00,local_68);
  this_00->ProgramHash = pmVar1->ProgramHash;
  this_00->OptionsHash = pmVar1->OptionsHash;
  this_00->ProgramNumber = pmVar1->ProgramNumber;
  this_00->CompileCount = pmVar1->CompileCount - 1;
  addShortKernelName(in_RSI,in_RDX);
  std::__cxx11::string::~string(local_68);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2093a2);
  return;
}

Assistant:

void CLIntercept::addKernelInfo(
    const cl_kernel kernel,
    const cl_program program,
    const std::string& kernelName )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    SKernelInfo& kernelInfo = m_KernelInfoMap[ kernel ];
    std::string demangledName = config().DemangleKernelNames ?
        demangle(kernelName) :
        kernelName;

    kernelInfo.KernelName = demangledName;

    kernelInfo.ProgramHash = programInfo.ProgramHash;
    kernelInfo.OptionsHash = programInfo.OptionsHash;

    kernelInfo.ProgramNumber = programInfo.ProgramNumber;
    kernelInfo.CompileCount = programInfo.CompileCount - 1;

    addShortKernelName( demangledName );
}